

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestMultiProcessHandler::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  int local_1c;
  cmCTestMultiProcessHandler *pcStack_18;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  local_1c = test;
  pcStack_18 = this;
  this_local = (cmCTestMultiProcessHandler *)__return_storage_ptr__;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_1c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(*ppcVar1)->Name);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestMultiProcessHandler::GetName(int test)
{
  return this->Properties[test]->Name;
}